

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server_test.c
# Opt level: O0

void test_server_post_handler(void)

{
  void *pvVar1;
  nng_http_client *pnVar2;
  nng_err nVar3;
  int iVar4;
  nng_http_status nVar5;
  char *pcVar6;
  size_t sVar7;
  void *pvVar8;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  void *data;
  size_t size;
  char *rxdata;
  nng_http_handler *pnStack_840;
  char txdata [5];
  nng_http_handler *h;
  server_test st;
  
  nVar3 = nng_http_handler_alloc(&stack0xfffffffffffff7c0,"/post",httpecho);
  pcVar6 = nng_strerror(nVar3);
  iVar4 = acutest_check_((uint)(nVar3 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                         ,0x24d,"%s: expected success, got %s (%d)",
                         "nng_http_handler_alloc(&h, \"/post\", httpecho)",pcVar6,nVar3);
  if (iVar4 == 0) {
    acutest_abort_();
  }
  nng_http_handler_set_method(pnStack_840,"POST");
  server_setup((server_test *)&h,pnStack_840);
  snprintf((char *)((long)&rxdata + 3),5,"1234");
  nVar3 = nng_http_set_uri((nng_http *)st.cli,"/post",(char *)0x0);
  pcVar6 = nng_strerror(nVar3);
  iVar4 = acutest_check_((uint)(nVar3 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                         ,0x254,"%s: expected success, got %s (%d)",
                         "nng_http_set_uri(st.conn, \"/post\", NULL)",pcVar6,nVar3);
  pnVar2 = st.cli;
  if (iVar4 == 0) {
    acutest_abort_();
  }
  sVar7 = strlen((char *)((long)&rxdata + 3));
  nng_http_set_body((nng_http *)pnVar2,(void *)((long)&rxdata + 3),sVar7);
  nng_http_set_method((nng_http *)st.cli,"POST");
  nVar3 = httpdo((server_test *)&h,(void **)&size,(size_t *)&data);
  pcVar6 = nng_strerror(nVar3);
  iVar4 = acutest_check_((uint)(nVar3 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                         ,599,"%s: expected success, got %s (%d)",
                         "httpdo(&st, (void **) &rxdata, &size)",pcVar6,nVar3);
  if (iVar4 == 0) {
    acutest_abort_();
  }
  nVar5 = nng_http_get_status((nng_http *)st.cli);
  acutest_check_((uint)(nVar5 == NNG_HTTP_STATUS_OK),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                 ,600,"%s","nng_http_get_status(st.conn) == (NNG_HTTP_STATUS_OK)");
  nVar5 = nng_http_get_status((nng_http *)st.cli);
  pcVar6 = nng_http_get_reason((nng_http *)st.cli);
  acutest_message_("HTTP status: expected %d (%s) got %d (%s)",200,"NNG_HTTP_STATUS_OK",(ulong)nVar5
                   ,pcVar6);
  pvVar1 = data;
  pvVar8 = (void *)strlen((char *)((long)&rxdata + 3));
  acutest_check_((uint)(pvVar1 == pvVar8),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                 ,0x259,"%s","size == strlen(txdata)");
  iVar4 = strncmp((char *)((long)&rxdata + 3),(char *)size,(size_t)data);
  acutest_check_((uint)(iVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                 ,0x25a,"%s","strncmp(txdata, rxdata, size) == 0");
  nng_free((void *)size,(size_t)data);
  server_reset((server_test *)&h);
  nVar3 = nng_http_set_uri((nng_http *)st.cli,"/post",(char *)0x0);
  pcVar6 = nng_strerror(nVar3);
  iVar4 = acutest_check_((uint)(nVar3 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                         ,0x25f,"%s: expected success, got %s (%d)",
                         "nng_http_set_uri(st.conn, \"/post\", NULL)",pcVar6,nVar3);
  if (iVar4 == 0) {
    acutest_abort_();
  }
  nng_http_set_method((nng_http *)st.cli,"GET");
  pnVar2 = st.cli;
  sVar7 = strlen((char *)((long)&rxdata + 3));
  nng_http_set_body((nng_http *)pnVar2,(void *)((long)&rxdata + 3),sVar7);
  nVar3 = httpdo((server_test *)&h,(void **)&result__1,(size_t *)&data);
  pcVar6 = nng_strerror(nVar3);
  iVar4 = acutest_check_((uint)(nVar3 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                         ,0x263,"%s: expected success, got %s (%d)","httpdo(&st, &data, &size)",
                         pcVar6,nVar3);
  if (iVar4 == 0) {
    acutest_abort_();
  }
  nVar5 = nng_http_get_status((nng_http *)st.cli);
  acutest_check_((uint)(nVar5 == NNG_HTTP_STATUS_METHOD_NOT_ALLOWED),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server_test.c"
                 ,0x264,"%s","nng_http_get_status(st.conn) == (NNG_HTTP_STATUS_METHOD_NOT_ALLOWED)")
  ;
  nVar5 = nng_http_get_status((nng_http *)st.cli);
  pcVar6 = nng_http_get_reason((nng_http *)st.cli);
  acutest_message_("HTTP status: expected %d (%s) got %d (%s)",0x195,
                   "NNG_HTTP_STATUS_METHOD_NOT_ALLOWED",(ulong)nVar5,pcVar6);
  nng_free(_result__1,(size_t)data);
  server_free((server_test *)&h);
  return;
}

Assistant:

static void
test_server_post_handler(void)
{
	struct server_test st;
	nng_http_handler  *h;
	char               txdata[5];
	char              *rxdata;
	size_t             size;
	void              *data;

	NUTS_PASS(nng_http_handler_alloc(&h, "/post", httpecho));
	nng_http_handler_set_method(h, "POST");

	server_setup(&st, h);

	snprintf(txdata, sizeof(txdata), "1234");

	NUTS_PASS(nng_http_set_uri(st.conn, "/post", NULL));
	nng_http_set_body(st.conn, txdata, strlen(txdata));
	nng_http_set_method(st.conn, "POST");
	NUTS_PASS(httpdo(&st, (void **) &rxdata, &size));
	NUTS_HTTP_STATUS(st.conn, NNG_HTTP_STATUS_OK);
	NUTS_TRUE(size == strlen(txdata));
	NUTS_TRUE(strncmp(txdata, rxdata, size) == 0);
	nng_free(rxdata, size);

	server_reset(&st);

	NUTS_PASS(nng_http_set_uri(st.conn, "/post", NULL));
	nng_http_set_method(st.conn, "GET");
	nng_http_set_body(st.conn, txdata, strlen(txdata));

	NUTS_PASS(httpdo(&st, &data, &size));
	NUTS_HTTP_STATUS(st.conn, NNG_HTTP_STATUS_METHOD_NOT_ALLOWED);
	nng_free(data, size);

	server_free(&st);
}